

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O3

bool __thiscall
llvm::DWARFDie::getLowAndHighPC
          (DWARFDie *this,uint64_t *LowPC,uint64_t *HighPC,uint64_t *SectionIndex)

{
  Optional<unsigned_long> OVar1;
  undefined1 local_80 [8];
  Optional<llvm::DWARFFormValue> F;
  Optional<llvm::object::SectionedAddress> LowPcAddr;
  
  find((Optional<llvm::DWARFFormValue> *)local_80,this,DW_AT_low_pc);
  if ((F.Storage.field_0._40_1_ == '\x01') &&
     (DWARFFormValue::getAsSectionedAddress
                ((Optional<llvm::object::SectionedAddress> *)&F.Storage.hasVal,
                 (DWARFFormValue *)local_80),
     (LowPcAddr.Storage.field_0.value.SectionIndex._0_1_ & 1) != 0)) {
    OVar1 = getHighPC(this,F.Storage._48_8_);
    if (((undefined1  [16])OVar1.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (LowPcAddr.Storage.field_0.value.SectionIndex._0_1_ != '\0') {
        *LowPC = F.Storage._48_8_;
        *HighPC = (uint64_t)OVar1.Storage.field_0;
        *SectionIndex = LowPcAddr.Storage.field_0.value.Address;
        return true;
      }
      __assert_fail("hasVal",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                    ,0xad,
                    "T &llvm::optional_detail::OptionalStorage<llvm::object::SectionedAddress>::getValue() & [T = llvm::object::SectionedAddress]"
                   );
    }
  }
  return false;
}

Assistant:

bool DWARFDie::getLowAndHighPC(uint64_t &LowPC, uint64_t &HighPC,
                               uint64_t &SectionIndex) const {
  auto F = find(DW_AT_low_pc);
  auto LowPcAddr = toSectionedAddress(F);
  if (!LowPcAddr)
    return false;
  if (auto HighPcAddr = getHighPC(LowPcAddr->Address)) {
    LowPC = LowPcAddr->Address;
    HighPC = *HighPcAddr;
    SectionIndex = LowPcAddr->SectionIndex;
    return true;
  }
  return false;
}